

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutitem.cpp
# Opt level: O2

int __thiscall QWidgetItem::heightForWidth(QWidgetItem *this,int w)

{
  QWidget *this_00;
  bool bVar1;
  int iVar2;
  Representation RVar3;
  QSize QVar4;
  QLayout *pQVar5;
  long in_FS_OFFSET;
  QSize local_20;
  long local_18;
  
  QVar4.ht.m_i = 0;
  QVar4.wd.m_i = w;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*(this->super_QLayoutItem)._vptr_QLayoutItem[8])();
  if ((char)iVar2 == '\0') {
    bVar1 = QWidget::testAttribute_helper(this->wid,WA_LayoutUsesWidgetRect);
    if (!bVar1) {
      local_20.ht.m_i = 0;
      local_20.wd.m_i = w;
      QVar4 = fromLayoutItemSize(*(QWidgetPrivate **)&this->wid->field_0x8,&local_20);
    }
    pQVar5 = QWidget::layout(this->wid);
    this_00 = this->wid;
    if (pQVar5 == (QLayout *)0x0) {
      RVar3.m_i = (**(code **)(*(long *)this_00 + 0x80))(this_00,(ulong)QVar4 & 0xffffffff);
    }
    else {
      pQVar5 = QWidget::layout(this_00);
      RVar3.m_i = QLayout::totalHeightForWidth(pQVar5,QVar4.wd.m_i.m_i);
    }
    iVar2 = QWidget::maximumHeight(this->wid);
    if (iVar2 < RVar3.m_i) {
      RVar3.m_i = QWidget::maximumHeight(this->wid);
    }
    iVar2 = QWidget::minimumHeight(this->wid);
    if (RVar3.m_i < iVar2) {
      RVar3.m_i = QWidget::minimumHeight(this->wid);
    }
    bVar1 = QWidget::testAttribute_helper(this->wid,WA_LayoutUsesWidgetRect);
    if (!bVar1) {
      local_20.wd.m_i = 0;
      local_20.ht.m_i = RVar3.m_i;
      QVar4 = toLayoutItemSize(*(QWidgetPrivate **)&this->wid->field_0x8,&local_20);
      RVar3 = QVar4.ht.m_i;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_002e680b;
    iVar2 = 0;
    if (0 < RVar3.m_i) {
      iVar2 = RVar3.m_i;
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_002e680b:
      __stack_chk_fail();
    }
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int QWidgetItem::heightForWidth(int w) const
{
    if (isEmpty())
        return -1;

    w = !wid->testAttribute(Qt::WA_LayoutUsesWidgetRect)
      ? fromLayoutItemSize(wid->d_func(), QSize(w, 0)).width()
      : w;

    int hfw;
    if (wid->layout())
        hfw = wid->layout()->totalHeightForWidth(w);
    else
        hfw = wid->heightForWidth(w);

    if (hfw > wid->maximumHeight())
        hfw = wid->maximumHeight();
    if (hfw < wid->minimumHeight())
        hfw = wid->minimumHeight();

    hfw = !wid->testAttribute(Qt::WA_LayoutUsesWidgetRect)
        ? toLayoutItemSize(wid->d_func(), QSize(0, hfw)).height()
        : hfw;

    if (hfw < 0)
        hfw = 0;
    return hfw;
}